

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O2

Var Js::JavascriptObject::GetValuesOrEntries
              (RecyclableObject *object,bool valuesToReturn,ScriptContext *scriptContext)

{
  code *pcVar1;
  uint32 itemIndex;
  ScriptContext *scriptContext_00;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  PropertyRecord *pPVar6;
  JavascriptArray *pJVar7;
  undefined4 extraout_var;
  JavascriptArray *value;
  Var pvVar8;
  undefined7 in_register_00000031;
  uint32 i;
  uint uVar9;
  undefined1 local_a0 [8];
  PropertyDescriptor propertyDescriptor;
  PropertyRecord *local_68;
  PropertyRecord *propertyRecord;
  ulong local_58;
  JavascriptArray *local_50;
  Type local_48;
  undefined4 local_44;
  RecyclableObject *local_40;
  ScriptContext *local_38;
  
  local_44 = (undefined4)CONCAT71(in_register_00000031,valuesToReturn);
  local_40 = object;
  local_38 = scriptContext;
  if (object == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x45d,"(object != nullptr)","object != nullptr");
    if (!bVar2) goto LAB_00b91cb5;
    *puVar5 = 0;
  }
  if (local_38 == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    pPVar6 = (PropertyRecord *)__tls_get_addr(&PTR_013e5f18);
    *(undefined4 *)
     &(pPVar6->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
         1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x45e,"(scriptContext != nullptr)","scriptContext != nullptr");
    if (!bVar2) {
LAB_00b91cb5:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)
     &(pPVar6->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
         0;
  }
  else {
    pPVar6 = (PropertyRecord *)__tls_get_addr(&PTR_013e5f18);
  }
  scriptContext_00 = local_38;
  local_58 = 0;
  local_50 = JavascriptLibrary::CreateArray((local_38->super_ScriptContextBase).javascriptLibrary,0)
  ;
  pJVar7 = JavascriptOperators::GetOwnPropertyNames(local_40,scriptContext_00);
  local_48 = (pJVar7->super_ArrayObject).length;
  local_68 = (PropertyRecord *)0x0;
  uVar9 = 0;
  propertyDescriptor._40_8_ = pJVar7;
  propertyRecord = pPVar6;
  do {
    pPVar6 = propertyRecord;
    if (local_48 == uVar9) {
      return local_50;
    }
    iVar3 = (*(pJVar7->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])(pJVar7,(ulong)uVar9);
    pvVar8 = (Var)CONCAT44(extraout_var,iVar3);
    bVar2 = VarIs<Js::JavascriptString>(pvVar8);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *(undefined4 *)
       &(pPVar6->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
           = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                  ,0x46a,"(VarIs<JavascriptString>(nextKey))",
                                  "VarIs<JavascriptString>(nextKey)");
      if (!bVar2) goto LAB_00b91cb5;
      *(undefined4 *)
       &(pPVar6->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
           = 0;
    }
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_a0);
    JavascriptConversion::ToPropertyKey(pvVar8,local_38,&local_68,(PropertyString **)0x0);
    iVar3 = local_68->pid;
    if (iVar3 == -1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      pPVar6 = propertyRecord;
      *(undefined4 *)
       &(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                  ,0x470,"(propertyId != Constants::NoProperty)",
                                  "propertyId != Constants::NoProperty");
      if (!bVar2) goto LAB_00b91cb5;
      *(undefined4 *)
       &(pPVar6->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
           = 0;
    }
    BVar4 = JavascriptOperators::GetOwnPropertyDescriptor
                      (local_40,iVar3,local_38,(PropertyDescriptor *)local_a0);
    if (BVar4 != 0) {
      bVar2 = PropertyDescriptor::IsEnumerable((PropertyDescriptor *)local_a0);
      if (bVar2) {
        value = (JavascriptArray *)
                JavascriptOperators::GetProperty(local_40,iVar3,local_38,(PropertyValueInfo *)0x0);
        pJVar7 = value;
        if ((char)local_44 == '\0') {
          pJVar7 = JavascriptLibrary::CreateArray
                             ((local_38->super_ScriptContextBase).javascriptLibrary,2);
          pvVar8 = CrossSite::MarshalVar(local_38,pvVar8,false);
          JavascriptArray::DirectSetItemAt<void*>(pJVar7,0,pvVar8);
          pvVar8 = CrossSite::MarshalVar(local_38,value,false);
          JavascriptArray::DirectSetItemAt<void*>(pJVar7,1,pvVar8);
        }
        itemIndex = (uint32)local_58;
        pvVar8 = CrossSite::MarshalVar(local_38,pJVar7,false);
        JavascriptArray::DirectSetItemAt<void*>(local_50,itemIndex,pvVar8);
        local_58 = (ulong)(itemIndex + 1);
        pJVar7 = (JavascriptArray *)propertyDescriptor._40_8_;
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

Var JavascriptObject::GetValuesOrEntries(RecyclableObject* object, bool valuesToReturn, ScriptContext* scriptContext)
{
    Assert(object != nullptr);
    Assert(scriptContext != nullptr);
    JavascriptArray* valuesArray = scriptContext->GetLibrary()->CreateArray(0);

    JavascriptArray* ownKeysResult = JavascriptOperators::GetOwnPropertyNames(object, scriptContext);
    uint32 length = ownKeysResult->GetLength();

    Var nextKey;
    const PropertyRecord* propertyRecord = nullptr;
    PropertyId propertyId;
    for (uint32 i = 0, index = 0; i < length; i++)
    {
        nextKey = ownKeysResult->DirectGetItem(i);
        Assert(VarIs<JavascriptString>(nextKey));

        PropertyDescriptor propertyDescriptor;

        JavascriptConversion::ToPropertyKey(nextKey, scriptContext, &propertyRecord, nullptr);
        propertyId = propertyRecord->GetPropertyId();
        Assert(propertyId != Constants::NoProperty);

        if (JavascriptOperators::GetOwnPropertyDescriptor(object, propertyId, scriptContext, &propertyDescriptor))
        {
            if (propertyDescriptor.IsEnumerable())
            {
                Var value = JavascriptOperators::GetProperty(object, propertyId, scriptContext);

                if (!valuesToReturn)
                {
                    // For Object.entries each entry is key, value pair
                    JavascriptArray* entry = scriptContext->GetLibrary()->CreateArray(2);
                    entry->DirectSetItemAt(0, CrossSite::MarshalVar(scriptContext, nextKey));
                    entry->DirectSetItemAt(1, CrossSite::MarshalVar(scriptContext, value));
                    value = entry;
                }
                valuesArray->DirectSetItemAt(index++, CrossSite::MarshalVar(scriptContext, value));
            }
        }
    }

    return valuesArray;
}